

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

bool __thiscall QPDF::checkLinearizationInternal(QPDF *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  const_reference this_00;
  QPDFObjectHandle *pQVar5;
  mapped_type *this_01;
  element_type *peVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar7;
  size_type sVar8;
  logic_error *this_02;
  longlong *plVar9;
  string_view msg;
  undefined1 local_3d8 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> shared_idx_to_obj;
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string_view local_2a8;
  mapped_type *local_298;
  ObjCache *oc;
  QPDFObjGen og_2;
  QPDFObjectHandle *oh;
  iterator __end1_1;
  iterator __begin1_1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1_1;
  qpdf_offset_t max_E;
  qpdf_offset_t min_E;
  string local_250;
  function<int_(QPDFObjectHandle_&)> local_230;
  int local_20c;
  QPDFXRefEntry *local_208;
  QPDFXRefEntry *entry;
  QPDFObjGen *og_1;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> object_stream_data;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string_view local_f8;
  char local_e5 [8];
  char ch;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string_view local_78;
  QPDFObjGen local_68;
  QPDFObjGen og;
  QPDFObjectHandle *page;
  size_t i;
  size_type local_40;
  int local_34;
  undefined1 auStack_30 [4];
  int npages;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_20;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  LinParameters *p;
  QPDF *this_local;
  
  p = (LinParameters *)this;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pages = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&pMVar4->linp;
  local_20 = getAllPages(this);
  iVar3 = *(int *)&(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
  this_00 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_20,0);
  iVar2 = QPDFObjectHandle::getObjectID(this_00);
  if (iVar3 != iVar2) {
    QTC::TC("qpdf","QPDF err /O mismatch",0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,
               "first page object (/O) mismatch");
    linearizationWarning(this,_auStack_30);
  }
  local_40 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_20);
  local_34 = toI<unsigned_long>(&local_40);
  if (*(int *)&pages[1].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_start != local_34) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&i,"page count (/N) mismatch");
    linearizationWarning(this,_i);
  }
  page = (QPDFObjectHandle *)0x0;
  while( true ) {
    pQVar5 = (QPDFObjectHandle *)toS<int>(&local_34);
    if (pQVar5 <= page) break;
    og = (QPDFObjGen)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                   (local_20,(size_type)page);
    local_68 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)og);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_01 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::operator[](&pMVar4->xref_table,&local_68);
    iVar3 = QPDFXRefEntry::getType(this_01);
    if (iVar3 == 2) {
      std::__cxx11::to_string(&local_d8,(unsigned_long)page);
      std::operator+(&local_b8,"page dictionary for page ",&local_d8);
      std::operator+(&local_98,&local_b8," is compressed");
      msg = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
      local_78 = msg;
      linearizationWarning(this,msg);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    page = (QPDFObjectHandle *)
           ((long)&(page->super_BaseHandle).obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1);
  }
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  (*peVar6->_vptr_InputSource[5])
            (peVar6,pages[1].super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                    ._M_impl.super__Vector_impl_data._M_finish,0);
  do {
    do {
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar4->file);
      (*peVar6->_vptr_InputSource[7])(peVar6,local_e5,1);
    } while (local_e5[0] == ' ');
  } while ((local_e5[0] == '\r') || (local_e5[0] == '\n'));
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  (*peVar6->_vptr_InputSource[5])(peVar6,0xffffffffffffffff,1);
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar4->file);
  iVar3 = (*peVar6->_vptr_InputSource[4])();
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (CONCAT44(extraout_var,iVar3) != pMVar4->first_xref_item_offset) {
    QTC::TC("qpdf","QPDF err /T mismatch",0);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    std::__cxx11::to_string(&local_178,pMVar4->first_xref_item_offset);
    std::operator+(&local_158,"space before first xref item (/T) mismatch (computed = ",&local_178);
    std::operator+(&local_138,&local_158,"; file = ");
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar6 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar4->file);
    iVar3 = (*peVar6->_vptr_InputSource[4])();
    std::__cxx11::to_string(&local_198,CONCAT44(extraout_var_00,iVar3));
    std::operator+(&local_118,&local_138,&local_198);
    local_f8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_118);
    linearizationWarning(this,local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((pMVar4->uncompressed_after_compressed & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &object_stream_data._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "linearized file contains an uncompressed object after a compressed one in a cross-reference stream"
              );
    linearizationWarning(this,stack0xfffffffffffffe58);
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&__range1
            );
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __end1 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::begin(&pMVar4->xref_table);
  iter = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::end(&pMVar4->xref_table);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) break;
    entry = (QPDFXRefEntry *)
            std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*(&__end1);
    local_208 = &((reference)entry)->second;
    og_1 = (QPDFObjGen *)entry;
    iVar3 = QPDFXRefEntry::getType(local_208);
    if (iVar3 == 2) {
      iVar3 = QPDFXRefEntry::getObjStreamNumber(local_208);
      local_20c = QPDFObjGen::getObj((QPDFObjGen *)entry);
      pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&__range1,&local_20c);
      *pmVar7 = iVar3;
    }
    std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end1);
  }
  std::function<int_(QPDFObjectHandle_&)>::function(&local_230,(nullptr_t)0x0);
  optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  &__range1,false,&local_230);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_230);
  calculateLinearizationData<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  &__range1);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&__range1
            );
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty(&pMVar4->part6);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"linearization part 6 unexpectedly empty",
               (allocator<char> *)((long)&min_E + 7));
    stopOnError(this,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator((allocator<char> *)((long)&min_E + 7));
  }
  max_E = -1;
  __range1_1 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)0xffffffffffffffff;
  pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __end1_1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(&pMVar4->part6)
  ;
  oh = (QPDFObjectHandle *)
       std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(&pMVar4->part6);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                        *)&oh);
    if (!bVar1) {
      if (((long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage < max_E) ||
         ((long)__range1_1 <
          (long)(pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage)) {
        QTC::TC("qpdf","QPDF warn /E mismatch",0);
        std::__cxx11::to_string
                  (&local_368,
                   (longlong)
                   (pages->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_348,"end of first page section (/E) mismatch: /E = ",&local_368);
        std::operator+(&local_328,&local_348,"; computed = ");
        std::__cxx11::to_string(&local_388,max_E);
        std::operator+(&local_308,&local_328,&local_388);
        std::operator+(&local_2e8,&local_308,"..");
        std::__cxx11::to_string
                  ((string *)&shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (longlong)__range1_1);
        std::operator+(&local_2c8,&local_2e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_2a8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2c8);
        linearizationWarning(this,local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string
                  ((string *)&shared_idx_to_obj._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_368);
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_3d8);
      checkHSharedObject(this,local_20,
                         (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)local_3d8);
      checkHPageOffset(this,local_20,
                       (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )local_3d8);
      checkHOutlines(this);
      pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      bVar1 = pMVar4->linearization_warnings;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_3d8);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
    og_2 = (QPDFObjGen)
           __gnu_cxx::
           __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
           ::operator*(&__end1_1);
    oc = (ObjCache *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)og_2);
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar8 = std::
            map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
            ::count(&pMVar4->obj_cache,(key_type *)&oc);
    if (sVar8 == 0) break;
    pMVar4 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    local_298 = std::
                map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                ::operator[](&pMVar4->obj_cache,(key_type *)&oc);
    plVar9 = std::max<long_long>(&max_E,&local_298->end_before_space);
    max_E = *plVar9;
    plVar9 = std::max<long_long>((longlong *)&__range1_1,&local_298->end_after_space);
    __range1_1 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)*plVar9;
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1_1);
  }
  this_02 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_02,"linearization part6 object not in cache");
  __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool
QPDF::checkLinearizationInternal()
{
    // All comments referring to the PDF spec refer to the spec for version 1.4.

    // Check all values in linearization parameter dictionary

    LinParameters& p = m->linp;

    // L: file size in bytes -- checked by isLinearized

    // O: object number of first page
    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    if (p.first_page_object != pages.at(0).getObjectID()) {
        QTC::TC("qpdf", "QPDF err /O mismatch");
        linearizationWarning("first page object (/O) mismatch");
    }

    // N: number of pages
    int npages = toI(pages.size());
    if (p.npages != npages) {
        // Not tested in the test suite
        linearizationWarning("page count (/N) mismatch");
    }

    for (size_t i = 0; i < toS(npages); ++i) {
        QPDFObjectHandle const& page = pages.at(i);
        QPDFObjGen og(page.getObjGen());
        if (m->xref_table[og].getType() == 2) {
            linearizationWarning(
                "page dictionary for page " + std::to_string(i) + " is compressed");
        }
    }

    // T: offset of whitespace character preceding xref entry for object 0
    m->file->seek(p.xref_zero_offset, SEEK_SET);
    while (true) {
        char ch;
        m->file->read(&ch, 1);
        if (!((ch == ' ') || (ch == '\r') || (ch == '\n'))) {
            m->file->seek(-1, SEEK_CUR);
            break;
        }
    }
    if (m->file->tell() != m->first_xref_item_offset) {
        QTC::TC("qpdf", "QPDF err /T mismatch");
        linearizationWarning(
            "space before first xref item (/T) mismatch (computed = " +
            std::to_string(m->first_xref_item_offset) +
            "; file = " + std::to_string(m->file->tell()));
    }

    // P: first page number -- Implementation note 124 says Acrobat ignores this value, so we will
    // too.

    // Check numbering of compressed objects in each xref section. For linearized files, all
    // compressed objects are supposed to be at the end of the containing xref section if any object
    // streams are in use.

    if (m->uncompressed_after_compressed) {
        linearizationWarning(
            "linearized file contains an uncompressed object after a compressed "
            "one in a cross-reference stream");
    }

    // Further checking requires optimization and order calculation. Don't allow optimization to
    // make changes.  If it has to, then the file is not properly linearized.  We use the xref table
    // to figure out which objects are compressed and which are uncompressed.
    { // local scope
        std::map<int, int> object_stream_data;
        for (auto const& iter: m->xref_table) {
            QPDFObjGen const& og = iter.first;
            QPDFXRefEntry const& entry = iter.second;
            if (entry.getType() == 2) {
                object_stream_data[og.getObj()] = entry.getObjStreamNumber();
            }
        }
        optimize_internal(object_stream_data, false, nullptr);
        calculateLinearizationData(object_stream_data);
    }

    // E: offset of end of first page -- Implementation note 123 says Acrobat includes on extra
    // object here by mistake.  pdlin fails to place thumbnail images in section 9, so when
    // thumbnails are present, it also gets the wrong value for /E.  It also doesn't count outlines
    // here when it should even though it places them in part 6.  This code fails to put thread
    // information dictionaries in part 9, so it actually gets the wrong value for E when threads
    // are present.  In that case, it would probably agree with pdlin.  As of this writing, the test
    // suite doesn't contain any files with threads.

    if (m->part6.empty()) {
        stopOnError("linearization part 6 unexpectedly empty");
    }
    qpdf_offset_t min_E = -1;
    qpdf_offset_t max_E = -1;
    for (auto const& oh: m->part6) {
        QPDFObjGen og(oh.getObjGen());
        if (m->obj_cache.count(og) == 0) {
            // All objects have to have been dereferenced to be classified.
            throw std::logic_error("linearization part6 object not in cache");
        }
        ObjCache const& oc = m->obj_cache[og];
        min_E = std::max(min_E, oc.end_before_space);
        max_E = std::max(max_E, oc.end_after_space);
    }
    if ((p.first_page_end < min_E) || (p.first_page_end > max_E)) {
        QTC::TC("qpdf", "QPDF warn /E mismatch");
        linearizationWarning(
            "end of first page section (/E) mismatch: /E = " + std::to_string(p.first_page_end) +
            "; computed = " + std::to_string(min_E) + ".." + std::to_string(max_E));
    }

    // Check hint tables

    std::map<int, int> shared_idx_to_obj;
    checkHSharedObject(pages, shared_idx_to_obj);
    checkHPageOffset(pages, shared_idx_to_obj);
    checkHOutlines();

    return !m->linearization_warnings;
}